

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

void opj_tgt_reset(opj_tgt_tree_t *p_tree)

{
  OPJ_UINT32 *pOVar1;
  OPJ_UINT32 OVar2;
  bool bVar3;
  
  if (p_tree != (opj_tgt_tree_t *)0x0) {
    OVar2 = p_tree->numnodes;
    pOVar1 = &p_tree->nodes->known;
    while (bVar3 = OVar2 != 0, OVar2 = OVar2 - 1, bVar3) {
      *(undefined8 *)(pOVar1 + -2) = 999;
      *pOVar1 = 0;
      pOVar1 = pOVar1 + 6;
    }
  }
  return;
}

Assistant:

void opj_tgt_reset(opj_tgt_tree_t *p_tree)
{
    OPJ_UINT32 i;
    opj_tgt_node_t * l_current_node = 00;;

    if (! p_tree) {
        return;
    }

    l_current_node = p_tree->nodes;
    for (i = 0; i < p_tree->numnodes; ++i) {
        l_current_node->value = 999;
        l_current_node->low = 0;
        l_current_node->known = 0;
        ++l_current_node;
    }
}